

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  size_t *psVar1;
  undefined8 *puVar2;
  HalfedgeMesh *pHVar3;
  pointer pVVar4;
  _Self __tmp;
  _Node *p_Var5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  pointer puVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  FaceIter FVar13;
  _List_node_base *p_Var14;
  ostream *poVar15;
  long lVar16;
  ulong uVar17;
  HalfedgeMesh *pHVar18;
  _Base_ptr p_Var19;
  _List_node_base *p_Var20;
  const_iterator __end2;
  pointer puVar21;
  pointer pvVar22;
  long lVar23;
  _Base_ptr p_Var24;
  mapped_type mVar25;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar26;
  const_iterator __begin2;
  pointer puVar27;
  pointer pvVar28;
  HalfedgeMesh *pHVar29;
  _Rb_tree_header *p_Var30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  HalfedgeIter hab;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> polygonIndices;
  unsigned_long i;
  Index a;
  VertexIter v;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  _List_iterator<CMU462::Halfedge> local_200;
  undefined1 local_1f8 [8];
  _List_iterator<CMU462::Halfedge> *p_Stack_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  _Base_ptr local_1d8;
  ulong local_1d0;
  _List_node_base *local_1c8;
  _List_node_base *local_1c0;
  key_type local_1b8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_1a8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_1a0;
  pointer local_198;
  _List_node_base *local_190;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_188;
  key_type local_180;
  pointer local_170;
  pointer local_168;
  long local_160;
  long local_158;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_150;
  _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  local_120;
  undefined1 local_f0 [16];
  _Base_ptr local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  double local_c8;
  
  local_1a8 = vertexPositions;
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  local_1c0 = (_List_node_base *)&this->vertices;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear
            ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)local_1c0);
  local_188 = &this->edges;
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(local_188);
  local_1c8 = (_List_node_base *)&this->faces;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_1c8);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar22 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_198 = (polygons->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  pvVar28 = pvVar22;
  local_1a0 = polygons;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar22 != local_198) {
    do {
      puVar27 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      puVar8 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)puVar8 - (long)puVar27) < 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                   ,0x5b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010b377;
      }
      p_Stack_1f0 = (_List_iterator<CMU462::Halfedge> *)((ulong)p_Stack_1f0 & 0xffffffff00000000);
      local_1e8 = (_Base_ptr)0x0;
      local_1e0 = (_Base_ptr)&p_Stack_1f0;
      local_1d0 = 0;
      puVar21 = puVar8;
      local_1d8 = local_1e0;
      if (puVar27 != puVar8) {
        do {
          p_Var30 = &local_150._M_impl.super__Rb_tree_header;
          local_1b8.first = *puVar27;
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_1f8,&local_1b8.first);
          p_Var10 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &p_Var30->_M_header;
          if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010aa70:
            memset((Vertex *)local_f0,0,0xc0);
            p_Var5 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::
                     _M_create_node<CMU462::Vertex>
                               ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)local_1c0,
                                (Vertex *)local_f0);
            std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
            psVar1 = &(this->vertices).
                      super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                      _M_node._M_size;
            *psVar1 = *psVar1 + 1;
            *(HalfedgeMesh **)((p_Var5->_M_storage)._M_storage + 0xb8) = this;
            local_180.first = (unsigned_long)p_Var5;
            pmVar6 = std::
                     map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                     ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                   *)&local_150,&local_1b8.first);
            pmVar6->_M_node = (_List_node_base *)local_180.first;
            pmVar7 = std::
                     map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                     ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                   *)&local_120,(key_type *)&local_180);
            *pmVar7 = 1;
          }
          else {
            do {
              p_Var24 = p_Var12;
              p_Var19 = p_Var10;
              p_Var14 = *(_List_node_base **)(p_Var19 + 1);
              p_Var12 = p_Var19;
              if (p_Var14 < local_1b8.first) {
                p_Var12 = p_Var24;
              }
              p_Var10 = (&p_Var19->_M_left)[p_Var14 < local_1b8.first];
            } while ((&p_Var19->_M_left)[p_Var14 < local_1b8.first] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var12 == p_Var30) goto LAB_0010aa70;
            if (p_Var14 < local_1b8.first) {
              p_Var19 = p_Var24;
            }
            if (local_1b8.first < *(_List_node_base **)(p_Var19 + 1)) goto LAB_0010aa70;
            pmVar6 = std::
                     map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                     ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                   *)&local_150,&local_1b8.first);
            pmVar7 = std::
                     map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                     ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                   *)&local_120,pmVar6);
            *pmVar7 = *pmVar7 + 1;
          }
          puVar27 = puVar27 + 1;
        } while (puVar27 != puVar8);
        puVar8 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar21 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_1d0 < (ulong)((long)puVar8 - (long)puVar21 >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                   ,0x66);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(vertex indices:",0x10);
        puVar8 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (puVar27 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start; puVar27 != puVar8;
            puVar27 = puVar27 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010b377;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_1f8);
      pvVar22 = pvVar22 + 1;
    } while (pvVar22 != local_198);
    pvVar22 = (local_1a0->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pvVar28 = (local_1a0->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_1c8,
             ((long)pvVar22 - (long)pvVar28 >> 3) * -0x5555555555555555);
  local_d8 = (_Base_ptr)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0 = (_Base_ptr)0x0;
  local_c8 = 0.0;
  pvVar22 = (local_1a0->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = local_d8;
  if (pvVar22 !=
      (local_1a0->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1c8 = local_1c8->_M_next;
      local_1f8 = (undefined1  [8])0x0;
      p_Stack_1f0 = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_1e8 = (_Base_ptr)0x0;
      puVar27 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      puVar8 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar23 = (long)puVar8 - (long)puVar27;
      if (lVar23 != 0) {
        local_158 = lVar23 >> 3;
        local_160 = -(ulong)(local_158 == 0) - local_158;
        lVar23 = 1;
        local_198 = pvVar22;
        local_170 = puVar8;
        local_168 = puVar27;
        do {
          puVar27 = (local_198->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_1b8.first = puVar27[lVar23 + -1];
          lVar16 = 0;
          if (local_158 != lVar23) {
            lVar16 = lVar23;
          }
          p_Var5 = (_Node *)puVar27[lVar16];
          local_200._M_node = (_List_node_base *)0x0;
          local_1b8.second = (unsigned_long)p_Var5;
          local_190 = (_List_node_base *)local_1b8.first;
          iVar9 = std::
                  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  ::find((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                          *)local_f0,&local_1b8);
          if (iVar9._M_node != (_Base_ptr)(local_f0 + 8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                       ,0x58);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,").",2);
            std::endl<char,std::char_traits<char>>(poVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                       ,0x67);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                       ,0x6f);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"not consistently oriented.",0x1a);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_0010b377;
          }
          p_Var10 = (_Base_ptr)operator_new(0x38);
          *(_List_node_base **)&p_Var10[1]._M_color = (_List_node_base *)0x0;
          p_Var10[1]._M_parent = (_Base_ptr)0x0;
          p_Var10->_M_left = (_Base_ptr)0x0;
          p_Var10->_M_right = (_Base_ptr)0x0;
          p_Var10[1]._M_left = (_Base_ptr)0x0;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var10);
          psVar1 = &(this->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_200._M_node = (_List_node_base *)p_Var10;
          pmVar11 = std::
                    map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                                  *)local_f0,&local_1b8);
          pmVar11->_M_node = local_200._M_node;
          local_200._M_node[3]._M_next = local_1c8;
          local_1c8[9]._M_next = local_200._M_node;
          pmVar6 = std::
                   map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                   ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                 *)&local_150,(key_type *)&local_190);
          p_Var14 = pmVar6->_M_node;
          *(_List_node_base **)(local_200._M_node + 2) = p_Var14;
          p_Var14[0xc]._M_prev = local_200._M_node;
          if ((_Base_ptr)p_Stack_1f0 == local_1e8) {
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
            ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                      ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                        *)local_1f8,(iterator)p_Stack_1f0,&local_200);
          }
          else {
            p_Stack_1f0->_M_node = local_200._M_node;
            p_Stack_1f0 = p_Stack_1f0 + 1;
          }
          local_180.second = (unsigned_long)local_190;
          local_180.first = (unsigned_long)p_Var5;
          iVar9 = std::
                  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  ::find((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                          *)local_f0,&local_180);
          if (iVar9._M_node == (_Base_ptr)(local_f0 + 8)) {
            local_200._M_node[1]._M_next = (_List_node_base *)this;
          }
          else {
            p_Var10 = iVar9._M_node[1]._M_left;
            local_200._M_node[1]._M_next = (_List_node_base *)p_Var10;
            p_Var10->_M_left = (_Base_ptr)local_200._M_node;
            p_Var12 = (_Base_ptr)operator_new(0x60);
            *(undefined8 *)((long)&p_Var12->_M_right + 1) = 0;
            *(undefined8 *)((long)&p_Var12[1]._M_color + 1) = 0;
            p_Var12->_M_left = (_Base_ptr)0x0;
            p_Var12->_M_right = (_Base_ptr)0x0;
            p_Var12[1]._M_left = (_Base_ptr)0x0;
            p_Var12[1]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var12 + 2) = 0;
            p_Var12[2]._M_parent = (_Base_ptr)0x0;
            p_Var12[2]._M_left = (_Base_ptr)0x0;
            p_Var12[2]._M_right = (_Base_ptr)0x0;
            std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var12);
            psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                      _M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            ((_Base_ptr)(local_200._M_node + 2))->_M_parent = p_Var12;
            p_Var10[1]._M_parent = p_Var12;
            p_Var12[2]._M_right = (_Base_ptr)local_200._M_node;
          }
          pvVar22 = local_198;
          lVar16 = local_160 + lVar23;
          lVar23 = lVar23 + 1;
        } while (lVar16 != 0);
        if (local_170 == local_168) {
          if (local_1f8 == (undefined1  [8])0x0) goto LAB_0010ae6f;
        }
        else {
          lVar23 = 1;
          do {
            lVar16 = 0;
            if (local_158 != lVar23) {
              lVar16 = lVar23;
            }
            *(_List_node_base **)(*(long *)((long)local_1f8 + lVar23 * 8 + -8) + 0x18) =
                 ((_List_node_base **)local_1f8)[lVar16];
            lVar16 = local_160 + lVar23;
            lVar23 = lVar23 + 1;
          } while (lVar16 != 0);
        }
        operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
      }
LAB_0010ae6f:
      pvVar22 = pvVar22 + 1;
    } while (pvVar22 !=
             (local_1a0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var14 = local_1c0->_M_next; p_Var14 != local_1c0; p_Var14 = p_Var14->_M_next) {
    p_Var20 = p_Var14[0xc]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var20[1]._M_next == this) {
        p_Var14[0xc]._M_prev = p_Var20;
        break;
      }
      p_Var20 = (((HalfedgeMesh *)p_Var20[1]._M_next)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_next;
    } while (p_Var14[0xc]._M_prev != p_Var20);
  }
  pHVar29 = (HalfedgeMesh *)
            (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  p_Var14 = local_1c0;
  pvVar26 = local_1a8;
  if (pHVar29 != this) {
    do {
      if ((HalfedgeMesh *)
          (pHVar29->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>
          ._M_impl._M_node._M_size == this) {
        FVar13 = newBoundary(this);
        local_1f8 = (undefined1  [8])0x0;
        p_Stack_1f0 = (_List_iterator<CMU462::Halfedge> *)0x0;
        local_1e8 = (_Base_ptr)0x0;
        pHVar18 = pHVar29;
LAB_0010aef9:
        p_Var14 = (_List_node_base *)operator_new(0x38);
        p_Var14[2]._M_next = (_List_node_base *)0x0;
        p_Var14[2]._M_prev = (_List_node_base *)0x0;
        p_Var14[1]._M_next = (_List_node_base *)0x0;
        p_Var14[1]._M_prev = (_List_node_base *)0x0;
        p_Var14[3]._M_next = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_1b8.first = (unsigned_long)p_Var14;
        if ((_Base_ptr)p_Stack_1f0 == local_1e8) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)local_1f8,(iterator)p_Stack_1f0,
                     (_List_iterator<CMU462::Halfedge> *)&local_1b8);
        }
        else {
          p_Stack_1f0->_M_node = p_Var14;
          p_Stack_1f0 = p_Stack_1f0 + 1;
        }
        (pHVar18->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
        _M_impl._M_node._M_size = local_1b8.first;
        ((_List_node_base *)(local_1b8.first + 0x10))->_M_next = (_List_node_base *)pHVar18;
        ((_List_node_base *)(local_1b8.first + 0x30))->_M_next = FVar13._M_node;
        ((_List_node_base *)(local_1b8.first + 0x20))->_M_next =
             (pHVar18->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
             _M_impl._M_node.super__List_node_base._M_next[2]._M_next;
        p_Var14 = (_List_node_base *)operator_new(0x60);
        *(undefined8 *)((long)&p_Var14[1]._M_prev + 1) = 0;
        *(undefined8 *)((long)&p_Var14[2]._M_next + 1) = 0;
        p_Var14[1]._M_next = (_List_node_base *)0x0;
        p_Var14[1]._M_prev = (_List_node_base *)0x0;
        p_Var14[3]._M_next = (_List_node_base *)0x0;
        p_Var14[3]._M_prev = (_List_node_base *)0x0;
        p_Var14[4]._M_next = (_List_node_base *)0x0;
        p_Var14[4]._M_prev = (_List_node_base *)0x0;
        p_Var14[5]._M_next = (_List_node_base *)0x0;
        p_Var14[5]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var14[5]._M_prev = (_List_node_base *)pHVar18;
        (pHVar18->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
        _M_impl._M_node._M_size = (size_t)p_Var14;
        ((_List_node_base *)(local_1b8.first + 0x20))->_M_prev = p_Var14;
        pHVar18 = (HalfedgeMesh *)
                  (pHVar18->vertices).
                  super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                  super__List_node_base._M_next;
LAB_0010afbb:
        if (pHVar29 == pHVar18) {
          FVar13._M_node[9]._M_next = *(_List_node_base **)local_1f8;
          if ((long)p_Stack_1f0 - (long)local_1f8 != 0) {
            uVar17 = (long)p_Stack_1f0 - (long)local_1f8 >> 3;
            lVar23 = 0;
            do {
              ((_List_node_base **)local_1f8)[lVar23][1]._M_prev =
                   ((_List_node_base **)local_1f8)[((uVar17 - 1) + lVar23) % uVar17];
              lVar23 = lVar23 + 1;
            } while (uVar17 + (uVar17 == 0) != lVar23);
          }
          operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
          p_Var14 = local_1c0;
          pvVar26 = local_1a8;
          goto LAB_0010b037;
        }
        pHVar3 = (HalfedgeMesh *)
                 (pHVar18->halfedges).
                 super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                 _M_node._M_size;
        if (pHVar3 != this) goto code_r0x0010afcd;
        goto LAB_0010aef9;
      }
LAB_0010b037:
      pHVar29 = (HalfedgeMesh *)
                (pHVar29->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_next;
    } while (pHVar29 != this);
  }
  local_1f8 = (undefined1  [8])
              (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var14->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
  if (local_1f8 != (undefined1  [8])p_Var14) {
    do {
      p_Var20 = ((_List_node_base *)local_1f8)->_M_next;
      ((_List_node_base *)((long)local_1f8 + 0xc0))->_M_prev =
           ((_List_node_base *)((long)local_1f8 + 0xc0))->_M_prev[1]._M_next[1]._M_prev;
      local_1f8 = (undefined1  [8])p_Var20;
    } while (p_Var20 != p_Var14);
    local_1f8 = (undefined1  [8])p_Var14->_M_next;
  }
  if (local_1f8 != (undefined1  [8])p_Var14) {
    do {
      pHVar29 = (HalfedgeMesh *)((_List_node_base *)((long)local_1f8 + 0xc0))->_M_prev;
      if (pHVar29 == this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                   ,0x5c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010b377;
      }
      mVar25 = 0;
      pHVar18 = pHVar29;
      do {
        mVar25 = mVar25 + ((ulong)*(byte *)&(pHVar18->edges).
                                            super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>
                                            ._M_impl._M_node.super__List_node_base._M_next[9].
                                            _M_prev ^ 1);
        pHVar18 = *(HalfedgeMesh **)
                   ((pHVar18->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size + 0x18);
      } while (pHVar18 != pHVar29);
      pmVar7 = std::
               map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
               ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                             *)&local_120,(key_type *)local_1f8);
      if (mVar25 != *pmVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                   ,0x58);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010b377;
      }
      local_1f8 = (undefined1  [8])*(_List_node_base **)local_1f8;
    } while (local_1f8 != (undefined1  [8])p_Var14);
  }
  if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size <=
      (ulong)(((long)(pvVar26->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar26->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    p_Var30 = &local_150._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_150._M_impl.super__Rb_tree_header._M_header._M_left != p_Var30) {
      lVar23 = 0;
      p_Var10 = local_150._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var12 = p_Var10[1]._M_parent;
        pVVar4 = (pvVar26->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(p_Var12 + 1) = *(undefined8 *)((long)&pVVar4->z + lVar23);
        puVar2 = (undefined8 *)((long)&pVVar4->x + lVar23);
        p_Var19 = (_Base_ptr)puVar2[1];
        p_Var12->_M_left = (_Base_ptr)*puVar2;
        p_Var12->_M_right = p_Var19;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        lVar23 = lVar23 + 0x18;
      } while ((_Rb_tree_header *)p_Var10 != p_Var30);
    }
    std::
    _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                 *)local_f0);
    std::
    _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_120);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
    ::~_Rb_tree(&local_150);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
             ,0x79);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(number of positions in input: ",0x1f);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
  std::endl<char,std::char_traits<char>>(poVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(  number of vertices in mesh: ",0x1f);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
  std::endl<char,std::char_traits<char>>(poVar15);
LAB_0010b377:
  exit(1);
code_r0x0010afcd:
  pHVar18 = (HalfedgeMesh *)
            (pHVar3->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  goto LAB_0010afbb;
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (const auto & polygon : polygons) {
    if (polygon.size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // construct something fairly meaningful for 1- and 2-point polygons, but
      // enforcing this stricter requirement on the input will help simplify code
      // further downstream, since it can be certain it doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (unsigned long i : polygon) {
      polygonIndices.insert(i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(i) == indexToVertex.end()) {
        auto v = newVertex();
        v->halfedge() = halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = polygon.size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (unsigned long i : polygon) {
        cerr << " " << i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      auto iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        auto hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        auto e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j = (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    auto h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (auto h = halfedgesBegin(); h != halfedgesEnd(); h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      auto b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      auto i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        auto t = newHalfedge();
        boundaryHalfedges.push_back(t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        auto e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (auto v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    auto h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    i++;
  }

}